

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

void ImageColorBrightness(Image *image,int brightness)

{
  uint uVar1;
  Color *pCVar2;
  uchar uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uchar uVar15;
  int iVar16;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    iVar7 = -0xff;
    if (-0xff < brightness) {
      iVar7 = brightness;
    }
    if (0xfe < iVar7) {
      iVar7 = 0xff;
    }
    pCVar2 = LoadImageColors(*image);
    iVar4 = image->height;
    iVar6 = 0;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    for (; iVar6 != iVar4; iVar6 = iVar6 + 1) {
      uVar1 = image->width;
      uVar8 = 0;
      if (0 < (int)uVar1) {
        uVar8 = (ulong)uVar1;
      }
      lVar9 = (long)(int)(uVar1 * iVar6);
      for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
        iVar11 = (uint)pCVar2[lVar9 + uVar10].r + iVar7;
        iVar12 = (uint)pCVar2[lVar9 + uVar10].g + iVar7;
        iVar13 = (uint)pCVar2[lVar9 + uVar10].b + iVar7;
        iVar14 = 0xff;
        if (iVar11 < 0xff) {
          iVar14 = iVar11;
        }
        iVar16 = 0xff;
        if (iVar12 < 0xff) {
          iVar16 = iVar12;
        }
        iVar5 = 0xff;
        if (iVar13 < 0xff) {
          iVar5 = iVar13;
        }
        uVar3 = (uchar)iVar14;
        if (iVar11 < 0) {
          uVar3 = '\x01';
        }
        uVar15 = (uchar)iVar16;
        if (iVar12 < 0) {
          uVar15 = '\x01';
        }
        pCVar2[lVar9 + uVar10].r = uVar3;
        pCVar2[lVar9 + uVar10].g = uVar15;
        uVar3 = (uchar)iVar5;
        if (iVar13 < 0) {
          uVar3 = '\x01';
        }
        pCVar2[lVar9 + uVar10].b = uVar3;
      }
    }
    iVar7 = image->format;
    free(image->data);
    image->data = pCVar2;
    image->format = 7;
    ImageFormat(image,iVar7);
    return;
  }
  return;
}

Assistant:

void ImageColorBrightness(Image *image, int brightness)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (brightness < -255) brightness = -255;
    if (brightness > 255) brightness = 255;

    Color *pixels = LoadImageColors(*image);

    for (int y = 0; y < image->height; y++)
    {
        for (int x = 0; x < image->width; x++)
        {
            int cR = pixels[y*image->width + x].r + brightness;
            int cG = pixels[y*image->width + x].g + brightness;
            int cB = pixels[y*image->width + x].b + brightness;

            if (cR < 0) cR = 1;
            if (cR > 255) cR = 255;

            if (cG < 0) cG = 1;
            if (cG > 255) cG = 255;

            if (cB < 0) cB = 1;
            if (cB > 255) cB = 255;

            pixels[y*image->width + x].r = (unsigned char)cR;
            pixels[y*image->width + x].g = (unsigned char)cG;
            pixels[y*image->width + x].b = (unsigned char)cB;
        }
    }

    int format = image->format;
    RL_FREE(image->data);

    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}